

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AllSyntax.cpp
# Opt level: O0

TokenOrSyntax * __thiscall
slang::syntax::MemberAccessExpressionSyntax::getChild
          (MemberAccessExpressionSyntax *this,size_t index)

{
  Token token;
  Token token_00;
  long in_RDX;
  Info *in_RSI;
  TokenOrSyntax *in_RDI;
  SyntaxNode *in_stack_ffffffffffffffa8;
  TokenOrSyntax *pTVar1;
  
  if (in_RDX == 0) {
    pTVar1 = in_RDI;
    not_null<slang::syntax::ExpressionSyntax_*>::get
              ((not_null<slang::syntax::ExpressionSyntax_*> *)&in_RSI[1].location);
    TokenOrSyntax::TokenOrSyntax(in_RDI,in_stack_ffffffffffffffa8);
  }
  else if (in_RDX == 1) {
    token.info = in_RSI;
    token._0_8_ = in_RDI;
    TokenOrSyntax::TokenOrSyntax(in_RDI,token);
    pTVar1 = in_RDI;
  }
  else if (in_RDX == 2) {
    token_00.info = in_RSI;
    token_00._0_8_ = in_RDI;
    TokenOrSyntax::TokenOrSyntax(in_RDI,token_00);
    pTVar1 = in_RDI;
  }
  else {
    TokenOrSyntax::TokenOrSyntax((TokenOrSyntax *)in_RSI,in_RDI);
    pTVar1 = in_RDI;
  }
  return pTVar1;
}

Assistant:

TokenOrSyntax MemberAccessExpressionSyntax::getChild(size_t index) {
    switch (index) {
        case 0: return left.get();
        case 1: return dot;
        case 2: return name;
        default: return nullptr;
    }
}